

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O2

Test * __thiscall ObjTable<Test>::emplace_back_large<int&>(ObjTable<Test> *this,int *args)

{
  iterator __position;
  reference pvVar1;
  size_t sVar2;
  
  __position._M_node = (this->sparse_elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar2 = 0xffffffffffffffff;
  do {
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->sparse_elements)._M_t._M_impl.super__Rb_tree_header) {
LAB_0011b930:
      this->min_sparse = sVar2;
      pvVar1 = std::vector<Test,std::allocator<Test>>::emplace_back<int&>
                         ((vector<Test,std::allocator<Test>> *)this,args);
      return pvVar1;
    }
    if (*(long *)(__position._M_node + 1) !=
        (long)(this->super_vector<Test,_std::allocator<Test>_>).
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(this->super_vector<Test,_std::allocator<Test>_>).
              super__Vector_base<Test,_std::allocator<Test>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2) {
      sVar2 = *(size_t *)(__position._M_node + 1);
      goto LAB_0011b930;
    }
    std::vector<Test,_std::allocator<Test>_>::emplace_back<Test>
              (&this->super_vector<Test,_std::allocator<Test>_>,
               (Test *)&__position._M_node[1]._M_parent);
    __position = std::
                 _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Test>,std::_Select1st<std::pair<unsigned_long_const,Test>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                 ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Test>,std::_Select1st<std::pair<unsigned_long_const,Test>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Test>>>
                                     *)&this->sparse_elements,__position);
  } while( true );
}

Assistant:

T&
    emplace_back_large(Args&&... args)
    {
        auto it = sparse_elements.begin();
        auto end = sparse_elements.end();
        while (it != end && it->first == std::vector<T>::size()) {
            std::vector<T>::emplace_back(std::move(it->second));
            it = sparse_elements.erase(it);
        }
        min_sparse = (it == end) ? std::numeric_limits<size_t>::max() : it->first;
        return std::vector<T>::emplace_back(std::forward<Args&&...>(args...));
    }